

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O0

int __thiscall obx::Store::close(Store *this,int __fd)

{
  bool bVar1;
  byte bVar2;
  element_type *peVar3;
  long lVar4;
  __pointer_type pOVar5;
  OBX_store *storeToClose;
  long useCount;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock;
  shared_ptr<obx::Closable> syncClient;
  Store *this_local;
  
  std::shared_ptr<obx::Closable>::shared_ptr((shared_ptr<obx::Closable> *)&lock);
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->syncClientMutex_);
  std::shared_ptr<obx::Closable>::operator=((shared_ptr<obx::Closable> *)&lock,&this->syncClient_);
  std::shared_ptr<obx::Closable>::shared_ptr((shared_ptr<obx::Closable> *)&useCount,(nullptr_t)0x0);
  std::shared_ptr<obx::Closable>::operator=
            (&this->syncClient_,(shared_ptr<obx::Closable> *)&useCount);
  std::shared_ptr<obx::Closable>::~shared_ptr((shared_ptr<obx::Closable> *)&useCount);
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&lock);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<obx::Closable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<obx::Closable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&lock);
    bVar2 = (**(code **)(*(long *)peVar3 + 0x10))();
    if ((bVar2 & 1) == 0) {
      lVar4 = std::__shared_ptr<obx::Closable,_(__gnu_cxx::_Lock_policy)2>::use_count
                        ((__shared_ptr<obx::Closable,_(__gnu_cxx::_Lock_policy)2> *)&lock);
      if (1 < lVar4) {
        printf("SyncClient still active with %ld references when store got closed\n",lVar4 + -1);
      }
      peVar3 = std::__shared_ptr_access<obx::Closable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<obx::Closable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&lock);
      (**(code **)(*(long *)peVar3 + 0x18))();
    }
  }
  std::shared_ptr<obx::Closable>::~shared_ptr((shared_ptr<obx::Closable> *)&lock);
  if ((this->owned_ & 1U) != 0) {
    pOVar5 = std::atomic<OBX_store_*>::exchange
                       (&this->cStore_,(__pointer_type)0x0,memory_order_seq_cst);
    this = (Store *)obx_store_close(pOVar5);
  }
  return (int)this;
}

Assistant:

void Store::close() {
    {
        // Clean up SyncClient by explicitly closing it, even if it isn't the only shared_ptr to the instance.
        // This prevents invalid use of store after it's been closed.
        std::shared_ptr<Closable> syncClient;
        {
            std::lock_guard<std::mutex> lock(syncClientMutex_);
            syncClient = std::move(syncClient_);
            syncClient_ = nullptr;  // to make the current state obvious
        }

        if (syncClient && !syncClient->isClosed()) {
#ifndef NDEBUG  // todo we probably want our LOG macros here too
            long useCount = syncClient.use_count();
            if (useCount > 1) {  // print external refs only thus "- 1"
                printf("SyncClient still active with %ld references when store got closed\n", (useCount - 1));
            }
#endif  // NDEBUG
            syncClient->close();
        }
    }

    if (owned_) {
        OBX_store* storeToClose = cStore_.exchange(nullptr);  // Close exactly once
        obx_store_close(storeToClose);
    }
}